

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_xprt.c
# Opt level: O2

int svc_xprt_fd_cmpf(opr_rbtree_node *lhs,opr_rbtree_node *rhs)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (*(int *)&rhs[-0xd].parent <= *(int *)&lhs[-0xd].parent) {
    uVar1 = (uint)(*(int *)&lhs[-0xd].parent != *(int *)&rhs[-0xd].parent);
  }
  return uVar1;
}

Assistant:

static inline int
svc_xprt_fd_cmpf(const struct opr_rbtree_node *lhs,
		 const struct opr_rbtree_node *rhs)
{
	struct rpc_dplx_rec *lk, *rk;

	lk = opr_containerof(lhs, struct rpc_dplx_rec, fd_node);
	rk = opr_containerof(rhs, struct rpc_dplx_rec, fd_node);

	if (lk->xprt.xp_fd < rk->xprt.xp_fd)
		return (-1);

	if (lk->xprt.xp_fd == rk->xprt.xp_fd)
		return (0);

	return (1);
}